

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1352d2::DirectoryTreeStructureSignatureTask::inputsAvailable
          (DirectoryTreeStructureSignatureTask *this,TaskInterface ti)

{
  pointer pSVar1;
  FileInfo *pFVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar3;
  Optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *this_00;
  BuildValue value;
  hash_code local_d0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  TaskInterface local_b0;
  BuildValue local_a0;
  
  local_b0.ctx = ti.ctx;
  local_b0.impl = ti.impl;
  local_d0 = llvm::hash_value<char>(&this->path);
  llbuild::buildsystem::BuildValue::fromData(&local_a0,&this->directoryValue);
  if (local_a0.kind == DirectoryContents) {
    pFVar2 = llbuild::buildsystem::BuildValue::getOutputInfo(&local_a0);
    local_d0 = llvm::hash_combine<llvm::hash_code,unsigned_long>(&local_d0,&pFVar2->mode);
  }
  else {
    local_c8._M_impl.super__Vector_impl_data._M_start =
         (pointer)llvm::hashing::detail::
                  hash_combine_range_impl<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                            ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              )(this->directoryValue).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              )(this->directoryValue).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish);
    local_d0 = llvm::hash_combine<llvm::hash_code,llvm::hash_code>(&local_d0,(hash_code *)&local_c8)
    ;
  }
  llbuild::buildsystem::BuildValue::~BuildValue(&local_a0);
  pSVar1 = (this->childResults).
           super__Vector_base<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = &((this->childResults).
                   super__Vector_base<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start)->directoryStructureSignatureValue;
      (pointer)((long)(this_00 + -2) + 8) != pSVar1;
      this_00 = (Optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                ((long)(this_00 + 2) + 0x18)) {
    local_d0 = llvm::hash_combine<llvm::hash_code,std::__cxx11::string>
                         (&local_d0,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)(this_00 + -2) + 8));
    llbuild::buildsystem::BuildValue::fromData(&local_a0,(ValueType *)((long)(this_00 + -1) + 8));
    if (local_a0.kind == ExistingInput) {
      pFVar2 = llbuild::buildsystem::BuildValue::getOutputInfo(&local_a0);
      local_d0 = llvm::hash_combine<llvm::hash_code,unsigned_long>(&local_d0,&pFVar2->mode);
    }
    else {
      local_c8._M_impl.super__Vector_impl_data._M_start =
           (pointer)llvm::hashing::detail::
                    hash_combine_range_impl<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                )*(uchar **)((long)(this_00 + -1) + 8),
                               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                )*(uchar **)((long)(this_00 + -1) + 0x10));
      local_d0 = llvm::hash_combine<llvm::hash_code,llvm::hash_code>
                           (&local_d0,(hash_code *)&local_c8);
    }
    if ((this_00->Storage).hasVal == true) {
      pvVar3 = llvm::Optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
               getPointer(this_00);
      local_c8._M_impl.super__Vector_impl_data._M_start =
           (pointer)llvm::hashing::detail::
                    hash_combine_range_impl<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                )(pvVar3->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_start,
                               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                )(pvVar3->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_finish);
      local_d0 = llvm::hash_combine<llvm::hash_code,llvm::hash_code>
                           (&local_d0,(hash_code *)&local_c8);
    }
    else {
      local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0xc183979c3e98722e;
      local_d0 = llvm::hash_combine<llvm::hash_code,unsigned_long>
                           (&local_d0,(unsigned_long *)&local_c8);
    }
    llbuild::buildsystem::BuildValue::~BuildValue(&local_a0);
  }
  local_a0.kind = DirectoryTreeStructureSignature;
  local_a0.numOutputInfos = 0;
  local_a0.signature.value = local_d0.value;
  local_a0.valueData.asOutputInfo.device = 0;
  local_a0.valueData.asOutputInfo.inode = 0;
  local_a0.valueData.asOutputInfo.mode = 0;
  local_a0.valueData.asOutputInfo.size = 0;
  local_a0.valueData.asOutputInfo.modTime.seconds = 0;
  local_a0.valueData.asOutputInfo.modTime.nanoseconds = 0;
  local_a0.valueData._48_8_ = 0;
  local_a0.valueData._56_8_ = 0;
  local_a0.valueData._64_8_ = 0;
  local_a0.valueData._72_8_ = 0;
  local_a0.stringValues.contents = (char *)0x0;
  local_a0.stringValues.size = 0;
  llbuild::buildsystem::BuildValue::toData((ValueType *)&local_c8,&local_a0);
  llbuild::core::TaskInterface::complete(&local_b0,(ValueType *)&local_c8,false);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c8);
  llbuild::buildsystem::BuildValue::~BuildValue(&local_a0);
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    // Compute the signature across all of the inputs.
    using llvm::hash_combine;
    llvm::hash_code code = hash_value(path);

    // Only merge the structure information on the directory itself.
    {
      // We need to merge mode information about the directory itself, in case
      // it changes type.
      auto value = BuildValue::fromData(directoryValue);
      if (value.isDirectoryContents()) {
        code = hash_combine(code, value.getOutputInfo().mode);
      } else {
        code = hash_combine(
            code, hash_combine_range(directoryValue.begin(),
                                     directoryValue.end()));
      }
    }
    
    // For now, we represent this task as the aggregation of all the inputs.
    for (const auto& info: childResults) {
      // We only merge the "structural" information on a child; i.e. its
      // filename and type.
      code = hash_combine(code, info.filename);
      auto value = BuildValue::fromData(info.value);
      if (value.isExistingInput()) {
        code = hash_combine(code, value.getOutputInfo().mode);
      } else {
        // If this node has been modified to report a non-file value, just merge
        // the encoded representation.
        code = hash_combine(
            code, hash_combine_range(info.value.begin(), info.value.end()));
      }
      
      if (info.directoryStructureSignatureValue.hasValue()) {
        auto& data = info.directoryStructureSignatureValue.getValue();
        code = hash_combine(
            code, hash_combine_range(data.begin(), data.end()));
      } else {
        // Combine a random number to represent nil.
        code = hash_combine(code, 0XC183979C3E98722E);
      }
    }
    
    // Compute the signature.
    ti.complete(BuildValue::makeDirectoryTreeStructureSignature(
                  CommandSignature(uint64_t(code))).toData());
  }